

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.c
# Opt level: O0

ErrorNumber
checkExpectedValue(TA_Real *data,TA_RetCode retCode,TA_RetCode expectedRetCode,uint outBegIdx,
                  uint expectedBegIdx,uint outNbElement,uint expectedNbElement,
                  TA_Real oneOfTheExpectedOutReal,uint oneOfTheExpectedOutRealIndex)

{
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  uint in_R8D;
  uint in_R9D;
  double in_XMM0_Qa;
  uint in_stack_00000010;
  ErrorNumber local_4;
  
  if (in_ESI == in_EDX) {
    if (in_ESI == 0) {
      if (in_R9D < 0x119) {
        if (in_R9D == oneOfTheExpectedOutReal._0_4_) {
          if (oneOfTheExpectedOutReal._0_4_ != 0) {
            if ((in_XMM0_Qa <= *(double *)(in_RDI + (ulong)in_stack_00000010 * 8) - 0.01) ||
               (*(double *)(in_RDI + (ulong)in_stack_00000010 * 8) + 0.01 <= in_XMM0_Qa)) {
              printf("Fail: For index %d, Expected value = %f but calculate value is %f\n",
                     in_XMM0_Qa,*(undefined8 *)(in_RDI + (ulong)in_stack_00000010 * 8),
                     (ulong)in_stack_00000010);
              return TA_TESTUTIL_TFRR_BAD_CALCULATION;
            }
            if (in_R8D != in_ECX) {
              printf("Fail: outBegIdx expected %d but got %d\n",(ulong)in_R8D,(ulong)in_ECX);
              return TA_TESTUTIL_TFRR_BAD_BEGIDX;
            }
          }
          local_4 = TA_TEST_PASS;
        }
        else {
          printf("Fail: outNbElement expected %d but got %d\n",
                 (ulong)oneOfTheExpectedOutReal & 0xffffffff,(ulong)in_R9D);
          local_4 = TA_TESTUTIL_TFRR_BAD_OUTNBELEMENT;
        }
      }
      else {
        printf("Fail: outNbElement is out of range 2 (%d)\n",(ulong)in_R9D);
        local_4 = TA_TEST_TFRR_NB_ELEMENT_OUT_OF_RANGE;
      }
    }
    else {
      local_4 = TA_TEST_PASS;
    }
  }
  else {
    printf("Fail: RetCode %d different than expected %d\n",(ulong)in_ESI,(ulong)in_EDX);
    local_4 = TA_TESTUTIL_TFRR_BAD_RETCODE;
  }
  return local_4;
}

Assistant:

ErrorNumber checkExpectedValue( const TA_Real *data,
                                TA_RetCode retCode, TA_RetCode expectedRetCode,
                                unsigned int outBegIdx, unsigned int expectedBegIdx,
                                unsigned int outNbElement, unsigned int expectedNbElement,
                                TA_Real oneOfTheExpectedOutReal,
                                unsigned int oneOfTheExpectedOutRealIndex )
{
   if( retCode != expectedRetCode )
   {
      printf( "Fail: RetCode %d different than expected %d\n", retCode, expectedRetCode );
      return TA_TESTUTIL_TFRR_BAD_RETCODE;
   }

   if( retCode != TA_SUCCESS )
   {
      /* An error did occured, but it
       * was expected. No need to go
       * further.
       */
      return TA_TEST_PASS;
   }

   if( outNbElement > MAX_NB_TEST_ELEMENT )
   {
       printf( "Fail: outNbElement is out of range 2 (%d)\n", outNbElement );
       return TA_TEST_TFRR_NB_ELEMENT_OUT_OF_RANGE;
   }


   /* Make sure the range of output does not contains NAN. */
   /* TODO Add back nan/inf checking
   for( i=0; i < outNbElement; i++ )
   {
      if( trio_isnan(data[i]) )
      {
         printf( "Fail: Not a number find within the data (%d,%f)\n", i, data[i] );
         return TA_TEST_TFRR_OVERLAP_OR_NAN_3;
      }
   }*/

   /* Verify that the expected output is there. */

   if( outNbElement != expectedNbElement )
   {
      printf( "Fail: outNbElement expected %d but got %d\n",
              expectedNbElement, outNbElement );
      return TA_TESTUTIL_TFRR_BAD_OUTNBELEMENT;
   }

   if( expectedNbElement > 0 )
   {
      if( !TA_REAL_EQ( oneOfTheExpectedOutReal, data[oneOfTheExpectedOutRealIndex], 0.01 ) )
      {
         printf( "Fail: For index %d, Expected value = %f but calculate value is %f\n",
                 oneOfTheExpectedOutRealIndex,
                 oneOfTheExpectedOutReal,
                 data[oneOfTheExpectedOutRealIndex] );
         return TA_TESTUTIL_TFRR_BAD_CALCULATION;
      }

      if( expectedBegIdx != outBegIdx )
      {
         printf( "Fail: outBegIdx expected %d but got %d\n", expectedBegIdx, outBegIdx );
         return TA_TESTUTIL_TFRR_BAD_BEGIDX;
      }
   }

   /* Succeed. */
   return TA_TEST_PASS;
}